

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O0

void __thiscall
TreeNode<JointActionObservationHistory>::SetSuccessor
          (TreeNode<JointActionObservationHistory> *this,LIndex sucI,
          TreeNode<JointActionObservationHistory> *suc)

{
  mapped_type pTVar1;
  bool bVar2;
  mapped_type *ppTVar3;
  ostream *poVar4;
  E *this_00;
  mapped_type in_RDX;
  ulonglong in_RSI;
  TreeNode<JointActionObservationHistory> *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  stringstream ss;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
  result_pair;
  pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*> arg_pair;
  stringstream *in_stack_fffffffffffffdd8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
  *in_stack_fffffffffffffde0;
  pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*> *in_stack_fffffffffffffde8;
  map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
  *in_stack_fffffffffffffdf0;
  TreeNode<JointActionObservationHistory> *in_stack_fffffffffffffdf8;
  key_type *in_stack_fffffffffffffe18;
  map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
  *in_stack_fffffffffffffe20;
  ostream local_1d0 [376];
  _Base_ptr local_58;
  undefined1 local_50;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
  local_48;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
  local_38;
  pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*> local_28;
  mapped_type local_18;
  ulonglong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = ExistsSuccessor(in_stack_fffffffffffffdf8,(LIndex)in_stack_fffffffffffffdf0);
  pTVar1 = local_18;
  if (bVar2) {
    ppTVar3 = std::
              map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
              ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    *ppTVar3 = pTVar1;
  }
  else {
    local_28 = std::make_pair<unsigned_long_long&,TreeNode<JointActionObservationHistory>*&>
                         ((unsigned_long_long *)in_stack_fffffffffffffde0,
                          (TreeNode<JointActionObservationHistory> **)in_stack_fffffffffffffdd8);
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
    ::
    pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool,_true>
              (in_stack_fffffffffffffde0);
    _Var5 = std::
            map<unsigned_long_long,TreeNode<JointActionObservationHistory>*,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<JointActionObservationHistory>*>>>
            ::insert<std::pair<unsigned_long_long,TreeNode<JointActionObservationHistory>*>&>
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_58 = (_Base_ptr)_Var5.first._M_node;
    local_50 = _Var5.second;
    local_48.first._M_node = local_58;
    local_48.second = (bool)local_50;
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>,_bool>
    ::operator=(&local_38,&local_48);
    if ((local_38.second & 1U) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe20);
      poVar4 = std::operator<<(local_1d0,"TreeNode<Tcontained>::SetSuccessor insertion failed, ");
      poVar4 = std::operator<<(poVar4,"but _m_successor[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
      std::operator<<(poVar4,"] wasn\'t already set ?!?");
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,in_stack_fffffffffffffdd8);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
  }
  SetPredeccessor(local_18,in_RDI);
  return;
}

Assistant:

void TreeNode<Tcontained>::SetSuccessor(LIndex sucI, 
    TreeNode<Tcontained>* suc)
{
    if( ExistsSuccessor(sucI) )
    {
#if DEBUG_TREENODE
        cout << "_m_successor["<< sucI<< "] already set: overwriting!\n";
#endif
        _m_successor[sucI] = suc;
    }
    else
    {    
        std::pair< LIndex, TreeNode<Tcontained>* > arg_pair = 
            std::make_pair(sucI, suc);
        std::pair< typename std::map< LIndex, TreeNode<Tcontained>* >::iterator, bool> 
            result_pair;
        result_pair = _m_successor.insert(arg_pair);
        if(result_pair.second == false)
        {
            std::stringstream ss;
            ss << "TreeNode<Tcontained>::SetSuccessor insertion failed, "
               << "but _m_successor["<< sucI<< "] wasn't already set ?!?";
            throw(E(ss));
        }
    }

    suc->SetPredeccessor(this);
}